

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGFreeTypeLibrary(void *payload,xmlChar *namespace)

{
  if (payload != (void *)0x0) {
    if (*payload != (void *)0x0) {
      (*xmlFree)(*payload);
    }
    (*xmlFree)(payload);
    return;
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeTypeLibrary(void *payload,
                          const xmlChar * namespace ATTRIBUTE_UNUSED)
{
    xmlRelaxNGTypeLibraryPtr lib = (xmlRelaxNGTypeLibraryPtr) payload;
    if (lib == NULL)
        return;
    if (lib->namespace != NULL)
        xmlFree((xmlChar *) lib->namespace);
    xmlFree(lib);
}